

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGTextPositioningElement::layoutElement
          (SVGTextPositioningElement *this,SVGLayoutState *state)

{
  AlignmentBaseline AVar1;
  DominantBaseline DVar2;
  TextAnchor TVar3;
  WhiteSpace WVar4;
  Direction DVar5;
  Paint *pPVar6;
  Length *length;
  BaselineShift *baselineShift;
  float fVar7;
  SVGPaintServer SVar8;
  undefined1 local_68 [8];
  LengthContext lengthContext;
  undefined4 local_50;
  undefined4 uStack_4c;
  SVGPaintElement *local_48;
  undefined8 local_40;
  undefined1 local_28 [24];
  SVGLayoutState *state_local;
  SVGTextPositioningElement *this_local;
  
  local_28._16_8_ = state;
  state_local = (SVGLayoutState *)this;
  SVGLayoutState::font((SVGLayoutState *)local_28);
  Font::operator=(&this->m_font,(Font *)local_28);
  Font::~Font((Font *)local_28);
  pPVar6 = SVGLayoutState::fill((SVGLayoutState *)local_28._16_8_);
  fVar7 = SVGLayoutState::fill_opacity((SVGLayoutState *)local_28._16_8_);
  SVar8 = SVGGraphicsElement::getPaintServer(&this->super_SVGGraphicsElement,pPVar6,fVar7);
  local_48 = SVar8.m_element;
  (this->m_fill).m_element = local_48;
  local_40 = SVar8._8_8_;
  (this->m_fill).m_color = (Color)(undefined4)local_40;
  (this->m_fill).m_opacity = (float)local_40._4_4_;
  pPVar6 = SVGLayoutState::stroke((SVGLayoutState *)local_28._16_8_);
  fVar7 = SVGLayoutState::stroke_opacity((SVGLayoutState *)local_28._16_8_);
  SVar8 = SVGGraphicsElement::getPaintServer(&this->super_SVGGraphicsElement,pPVar6,fVar7);
  lengthContext._8_8_ = SVar8.m_element;
  (this->m_stroke).m_element = (SVGPaintElement *)lengthContext._8_8_;
  _local_50 = SVar8._8_8_;
  (this->m_stroke).m_color = (Color)local_50;
  (this->m_stroke).m_opacity = (float)uStack_4c;
  unique0x1000025c = SVar8;
  SVGElement::layoutElement((SVGElement *)this,(SVGLayoutState *)local_28._16_8_);
  LengthContext::LengthContext((LengthContext *)local_68,(SVGElement *)this,UserSpaceOnUse);
  length = SVGLayoutState::stroke_width((SVGLayoutState *)local_28._16_8_);
  fVar7 = LengthContext::valueForLength((LengthContext *)local_68,length,Diagonal);
  this->m_stroke_width = fVar7;
  baselineShift = SVGLayoutState::baseline_shit((SVGLayoutState *)local_28._16_8_);
  fVar7 = convertBaselineOffset(this,baselineShift);
  this->m_baseline_offset = fVar7;
  AVar1 = SVGLayoutState::alignment_baseline((SVGLayoutState *)local_28._16_8_);
  this->m_alignment_baseline = AVar1;
  DVar2 = SVGLayoutState::dominant_baseline((SVGLayoutState *)local_28._16_8_);
  this->m_dominant_baseline = DVar2;
  TVar3 = SVGLayoutState::text_anchor((SVGLayoutState *)local_28._16_8_);
  this->m_text_anchor = TVar3;
  WVar4 = SVGLayoutState::white_space((SVGLayoutState *)local_28._16_8_);
  this->m_white_space = WVar4;
  DVar5 = SVGLayoutState::direction((SVGLayoutState *)local_28._16_8_);
  this->m_direction = DVar5;
  return;
}

Assistant:

void SVGTextPositioningElement::layoutElement(const SVGLayoutState& state)
{
    m_font = state.font();
    m_fill = getPaintServer(state.fill(), state.fill_opacity());
    m_stroke = getPaintServer(state.stroke(), state.stroke_opacity());
    SVGGraphicsElement::layoutElement(state);

    LengthContext lengthContext(this);
    m_stroke_width = lengthContext.valueForLength(state.stroke_width(), LengthDirection::Diagonal);
    m_baseline_offset = convertBaselineOffset(state.baseline_shit());
    m_alignment_baseline = state.alignment_baseline();
    m_dominant_baseline = state.dominant_baseline();
    m_text_anchor = state.text_anchor();
    m_white_space = state.white_space();
    m_direction = state.direction();
}